

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O1

void __thiscall
OpenDataServerCommand::setParameters
          (OpenDataServerCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *params)

{
  pointer pcVar1;
  MathInterpreter *this_00;
  DataBase *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *data;
  Expression *pEVar2;
  double extraout_XMM0_Qa;
  string local_48;
  
  std::__cxx11::string::_M_assign((string *)&this->port_string);
  this_00 = (MathInterpreter *)operator_new(0x20);
  this_01 = DataBase::getInstance();
  data = DataBase::getInVarMap_abi_cxx11_(this_01);
  MathInterpreter::MathInterpreter(this_00,data);
  pcVar1 = (this->port_string)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->port_string)._M_string_length);
  pEVar2 = MathInterpreter::interpret(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (**pEVar2->_vptr_Expression)(pEVar2);
  this->port = (unsigned_short)(int)extraout_XMM0_Qa;
  (*pEVar2->_vptr_Expression[2])(pEVar2);
  MathInterpreter::~MathInterpreter(this_00);
  operator_delete(this_00,0x20);
  return;
}

Assistant:

void OpenDataServerCommand::setParameters(vector<string> params) {
  this->port_string = params[1];
  MathInterpreter *m = new MathInterpreter(DataBase::getInstance()->getInVarMap());
  Expression* e = m->interpret(this->port_string);
  this->port = e->calculate();
  delete e;
  delete m;
}